

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O1

vertex_iterator __thiscall
xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::
ObtainVertexFromVertexMap
          (Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
           *this,StateExample *state)

{
  _Hash_node_base *p_Var1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>,_false>
  _Var4;
  undefined8 *puVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  
  p_Var1 = (_Hash_node_base *)state->id;
  uVar2 = (this->vertex_map_)._M_h._M_bucket_count;
  uVar6 = (ulong)p_Var1 % uVar2;
  p_Var7 = (this->vertex_map_)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var1 != p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar6) ||
         (p_Var8 = p_Var7, p_Var1 == p_Var3[1]._M_nxt)) goto LAB_001059d0;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_001059d0:
  if (p_Var8 == (__node_base_ptr)0x0) {
    _Var4._M_cur = (__node_type *)0x0;
  }
  else {
    _Var4._M_cur = (__node_type *)p_Var8->_M_nxt;
  }
  if ((_Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>,_false>
       )_Var4._M_cur ==
      (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>,_false>
       )0x0) {
    puVar5 = (undefined8 *)operator_new(0x70);
    *puVar5 = state;
    puVar5[1] = p_Var1;
    puVar5[4] = puVar5 + 3;
    puVar5[3] = puVar5 + 3;
    puVar5[5] = 0;
    puVar5[7] = puVar5 + 6;
    puVar5[6] = puVar5 + 6;
    puVar5[8] = 0;
    *(undefined1 *)(puVar5 + 9) = 0;
    *(undefined1 *)((long)puVar5 + 0x49) = 0;
    *(undefined4 *)(puVar5 + 10) = 0xffffffff;
    *(undefined4 *)((long)puVar5 + 0x54) = 0x7fefffff;
    *(undefined4 *)(puVar5 + 0xb) = 0xffffffff;
    *(undefined4 *)((long)puVar5 + 0x5c) = 0x7fefffff;
    puVar5[0xc] = 0x7fefffffffffffff;
    puVar5[0xd] = 0;
    std::
    _Hashtable<long,std::pair<long_const,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<long,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>>
              ((_Hashtable<long,std::pair<long_const,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->vertex_map_);
    uVar2 = (this->vertex_map_)._M_h._M_bucket_count;
    uVar6 = (ulong)p_Var1 % uVar2;
    p_Var7 = (this->vertex_map_)._M_h._M_buckets[uVar6];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var1 != p_Var7->_M_nxt[1]._M_nxt)) {
      while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar6) ||
           (p_Var8 = p_Var7, p_Var1 == p_Var3[1]._M_nxt)) goto LAB_00105aad;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_00105aad:
    if (p_Var8 == (__node_base_ptr)0x0) {
      _Var4._M_cur = (__node_type *)0x0;
    }
    else {
      _Var4._M_cur = (__node_type *)p_Var8->_M_nxt;
    }
  }
  return (vertex_iterator)_Var4._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}